

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpMapMatrix.cpp
# Opt level: O3

void mnf::ExpMapMatrix::logarithm(RefVec *out,OutputType *R)

{
  undefined8 *puVar1;
  double dVar2;
  double dVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  bool bVar7;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  Vector3d v;
  undefined1 local_68 [16];
  double local_58;
  double local_48;
  undefined8 uStack_40;
  undefined1 local_38 [16];
  undefined1 local_28 [24];
  
  local_48 = (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[3];
  uStack_40 = 0;
  local_58 = -local_48;
  local_68._8_8_ =
       (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6];
  local_68._0_8_ =
       -(R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7];
  dVar2 = acos(((R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
                array[4] +
                (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
                array[8] +
                (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
                array[0] + -1.0) * 0.5);
  if (1e-08 <= SQRT(local_48 * local_48 +
                    (double)local_68._8_8_ * (double)local_68._8_8_ +
                    (double)local_68._0_8_ * (double)local_68._0_8_)) {
    local_48 = (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[1] -
               (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[3];
    dVar3 = (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
            [6] - (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                  .array[2];
    local_28._8_4_ = SUB84(dVar3,0);
    local_28._0_8_ =
         (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
         - (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
           [7];
    local_28._12_4_ = (int)((ulong)dVar3 >> 0x20);
    local_38._8_4_ = extraout_XMM0_Dc;
    local_38._0_8_ = dVar2;
    local_38._12_4_ = extraout_XMM0_Dd;
    dVar2 = sin(dVar2);
    local_58 = (double)local_38._0_8_ / (dVar2 + dVar2);
    local_68._8_4_ = SUB84(local_58 * (double)local_28._8_8_,0);
    local_68._0_8_ = local_58 * (double)local_28._0_8_;
    local_68._12_4_ = (int)((ulong)(local_58 * (double)local_28._8_8_) >> 0x20);
    local_58 = local_58 * local_48;
  }
  if (*(long *)&(out->
                super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                ).field_0x8 == 3) {
    puVar1 = *(undefined8 **)
              &out->
               super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
    ;
    if (((ulong)puVar1 & 7) == 0) {
      bVar7 = ((ulong)puVar1 & 8) != 0;
      if (bVar7) {
        *puVar1 = local_68._0_8_;
        uVar5 = 3;
      }
      else {
        uVar5 = 2;
      }
      uVar4 = bVar7 | 2;
      if ((bVar7 | 2) < uVar5) {
        uVar4 = uVar5;
      }
      memcpy((void *)((long)puVar1 + (ulong)((uint)bVar7 * 8)),local_68 + (uint)bVar7 * 8,
             ((ulong)((uVar4 + ~(uint)bVar7) * 8) & 0xfffffffffffffff0) + 0x10);
      if (((ulong)puVar1 & 8) == 0) {
        uVar6 = (ulong)(uVar5 << 3);
        memcpy((void *)((long)puVar1 + uVar6),local_68 + uVar6,uVar6 ^ 0x18);
      }
    }
    else {
      puVar1[2] = local_58;
      *puVar1 = local_68._0_8_;
      puVar1[1] = local_68._8_8_;
    }
    return;
  }
  __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                "void Eigen::DenseBase<Eigen::Ref<Eigen::Matrix<double, -1, 1>>>::resize(Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, 1>>]"
               );
}

Assistant:

void ExpMapMatrix::logarithm(RefVec out, const OutputType& R)
{
  Eigen::Vector3d v(-R(1, 2), R(0, 2), -R(0, 1));
  double acosTr = std::acos((R.trace() - 1) / 2);
  if (v.norm() < prec)
    out = v;
  else
  {
    OutputType diff(R - R.transpose());
    double coeff = acosTr / (2 * std::sin(acosTr));
    v(0) = diff(2, 1) * coeff;
    v(1) = diff(0, 2) * coeff;
    v(2) = diff(1, 0) * coeff;
    out = v;
  }
}